

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringify-walker-impl.h
# Opt level: O1

void __thiscall
wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::dequeueControlFlow
          (StringifyWalker<wasm::ReconstructStringifyWalker> *this)

{
  Id IVar1;
  Expression *pEVar2;
  uintptr_t uVar3;
  SeparatorReason reason;
  SeparatorReason reason_00;
  SeparatorReason reason_01;
  SeparatorReason reason_02;
  SeparatorReason reason_03;
  SeparatorReason reason_04;
  SeparatorReason reason_05;
  SeparatorReason reason_06;
  _Variadic_union<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
  in_RAX;
  undefined8 unaff_RBX;
  ReconstructStringifyWalker *self;
  _Variadic_union<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
  _Var4;
  long lVar5;
  ulong uVar6;
  Try *tryy;
  undefined1 in_stack_00000008 [16];
  _Variadic_union<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
  _Var7;
  
  pEVar2 = *(this->controlFlowQueue).c.
            super__Deque_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
            super__Deque_impl_data._M_start._M_cur;
  std::deque<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::pop_front
            (&(this->controlFlowQueue).c);
  IVar1 = pEVar2->_id;
  if (IVar1 < LoopId) {
    if (IVar1 == BlockId) {
      reason_05.reason.
      super__Variant_base<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
      .
      super__Move_assign_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
      .
      super__Copy_assign_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
      .
      super__Move_ctor_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
      .
      super__Copy_ctor_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
      .
      super__Variant_storage_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
      ._8_8_ = unaff_RBX;
      reason_05.reason.
      super__Variant_base<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
      .
      super__Move_assign_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
      .
      super__Copy_assign_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
      .
      super__Move_ctor_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
      .
      super__Copy_ctor_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
      .
      super__Variant_storage_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
      ._M_u = in_RAX;
      ReconstructStringifyWalker::addUniqueSymbol((ReconstructStringifyWalker *)this,reason_05);
      uVar3 = pEVar2[2].type.id;
      if (uVar3 != 0) {
        lVar5 = 0;
        uVar6 = 0;
        do {
          if (pEVar2[2].type.id <= uVar6) goto LAB_008bc12d;
          Walker<wasm::ReconstructStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::ReconstructStringifyWalker,_void>_>
          ::walk((Walker<wasm::ReconstructStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::ReconstructStringifyWalker,_void>_>
                  *)this,(Expression **)(*(long *)(pEVar2 + 2) + lVar5));
          uVar6 = uVar6 + 1;
          lVar5 = lVar5 + 8;
        } while (uVar3 != uVar6);
      }
      goto LAB_008bc110;
    }
    if (IVar1 != IfId) goto LAB_008bc169;
    reason_03.reason.
    super__Variant_base<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Move_assign_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Copy_assign_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Move_ctor_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Copy_ctor_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Variant_storage_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    ._8_8_ = unaff_RBX;
    reason_03.reason.
    super__Variant_base<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Move_assign_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Copy_assign_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Move_ctor_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Copy_ctor_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Variant_storage_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    ._M_u = in_RAX;
    ReconstructStringifyWalker::addUniqueSymbol((ReconstructStringifyWalker *)this,reason_03);
    Walker<wasm::ReconstructStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::ReconstructStringifyWalker,_void>_>
    ::walk((Walker<wasm::ReconstructStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::ReconstructStringifyWalker,_void>_>
            *)this,(Expression **)&pEVar2[1].type);
    if (*(long *)(pEVar2 + 2) == 0) goto LAB_008bc110;
    reason_04.reason.
    super__Variant_base<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Move_assign_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Copy_assign_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Move_ctor_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Copy_ctor_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Variant_storage_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    ._8_8_ = unaff_RBX;
    reason_04.reason.
    super__Variant_base<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Move_assign_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Copy_assign_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Move_ctor_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Copy_ctor_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Variant_storage_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    ._M_u = in_RAX;
    ReconstructStringifyWalker::addUniqueSymbol((ReconstructStringifyWalker *)this,reason_04);
  }
  else {
    if (IVar1 != LoopId) {
      if (IVar1 == TryId) {
        reason.reason.
        super__Variant_base<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
        .
        super__Move_assign_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
        .
        super__Copy_assign_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
        .
        super__Move_ctor_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
        .
        super__Copy_ctor_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
        .
        super__Variant_storage_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
        ._8_8_ = unaff_RBX;
        reason.reason.
        super__Variant_base<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
        .
        super__Move_assign_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
        .
        super__Copy_assign_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
        .
        super__Move_ctor_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
        .
        super__Copy_ctor_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
        .
        super__Variant_storage_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
        ._M_u = in_RAX;
        ReconstructStringifyWalker::addUniqueSymbol((ReconstructStringifyWalker *)this,reason);
        Walker<wasm::ReconstructStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::ReconstructStringifyWalker,_void>_>
        ::walk((Walker<wasm::ReconstructStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::ReconstructStringifyWalker,_void>_>
                *)this,(Expression **)(pEVar2 + 2));
        reason_00.reason.
        super__Variant_base<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
        .
        super__Move_assign_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
        .
        super__Copy_assign_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
        .
        super__Move_ctor_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
        .
        super__Copy_ctor_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
        .
        super__Variant_storage_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
        ._8_8_ = unaff_RBX;
        reason_00.reason.
        super__Variant_base<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
        .
        super__Move_assign_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
        .
        super__Copy_assign_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
        .
        super__Move_ctor_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
        .
        super__Copy_ctor_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
        .
        super__Variant_storage_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
        ._M_u = in_RAX;
        ReconstructStringifyWalker::addUniqueSymbol((ReconstructStringifyWalker *)this,reason_00);
        _Var7 = *(_Variadic_union<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
                  *)(pEVar2 + 5);
        if (_Var7 != (_Variadic_union<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
                      )0x0) {
          lVar5 = 0;
          _Var4 = (_Variadic_union<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
                   )0x0;
          do {
            if ((ulong)*(_Variadic_union<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
                         *)(pEVar2 + 5) <= (ulong)_Var4) {
LAB_008bc12d:
              __assert_fail("index < usedElements",
                            "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/mixed_arena.h"
                            ,0xbc,
                            "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                           );
            }
            uVar3 = pEVar2[4].type.id;
            reason_01.reason.
            super__Variant_base<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
            .
            super__Move_assign_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
            .
            super__Copy_assign_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
            .
            super__Move_ctor_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
            .
            super__Copy_ctor_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
            .
            super__Variant_storage_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
            ._8_8_ = unaff_RBX;
            reason_01.reason.
            super__Variant_base<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
            .
            super__Move_assign_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
            .
            super__Copy_assign_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
            .
            super__Move_ctor_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
            .
            super__Copy_ctor_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
            .
            super__Variant_storage_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
            ._M_u = _Var7;
            ReconstructStringifyWalker::addUniqueSymbol
                      ((ReconstructStringifyWalker *)this,reason_01);
            Walker<wasm::ReconstructStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::ReconstructStringifyWalker,_void>_>
            ::walk((Walker<wasm::ReconstructStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::ReconstructStringifyWalker,_void>_>
                    *)this,(Expression **)(uVar3 + lVar5));
            reason_02.reason.
            super__Variant_base<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
            .
            super__Move_assign_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
            .
            super__Copy_assign_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
            .
            super__Move_ctor_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
            .
            super__Copy_ctor_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
            .
            super__Variant_storage_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
            ._8_8_ = unaff_RBX;
            reason_02.reason.
            super__Variant_base<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
            .
            super__Move_assign_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
            .
            super__Copy_assign_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
            .
            super__Move_ctor_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
            .
            super__Copy_ctor_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
            .
            super__Variant_storage_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
            ._M_u = _Var7;
            ReconstructStringifyWalker::addUniqueSymbol
                      ((ReconstructStringifyWalker *)this,reason_02);
            _Var4 = (_Variadic_union<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
                     )((long)_Var4 + 1);
            lVar5 = lVar5 + 8;
          } while (_Var7 != _Var4);
        }
        return;
      }
      if (IVar1 == TryTableId) {
        handle_unreachable("unexpected expression",
                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/stringify-walker-impl.h"
                           ,0x77);
      }
LAB_008bc169:
      __assert_fail("Properties::isControlFlowStructure(curr)",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/stringify-walker-impl.h"
                    ,0x76,
                    "void wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::dequeueControlFlow() [SubType = wasm::ReconstructStringifyWalker]"
                   );
    }
    reason_06.reason.
    super__Variant_base<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Move_assign_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Copy_assign_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Move_ctor_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Copy_ctor_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Variant_storage_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    ._8_8_ = unaff_RBX;
    reason_06.reason.
    super__Variant_base<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Move_assign_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Copy_assign_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Move_ctor_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Copy_ctor_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Variant_storage_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    ._M_u = in_RAX;
    ReconstructStringifyWalker::addUniqueSymbol((ReconstructStringifyWalker *)this,reason_06);
  }
  Walker<wasm::ReconstructStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::ReconstructStringifyWalker,_void>_>
  ::walk((Walker<wasm::ReconstructStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::ReconstructStringifyWalker,_void>_>
          *)this,(Expression **)(pEVar2 + 2));
LAB_008bc110:
  ReconstructStringifyWalker::addUniqueSymbol
            ((ReconstructStringifyWalker *)this,(SeparatorReason)in_stack_00000008);
  return;
}

Assistant:

void StringifyWalker<SubType>::dequeueControlFlow() {
  auto& queue = controlFlowQueue;
  Expression* curr = queue.front();
  queue.pop();
  DBG(std::cerr << "controlFlowQueue.pop: " << ShallowExpression{curr} << ", "
                << curr << "\n");

  // TODO: Issue #5796, Make a ControlChildIterator
  switch (curr->_id) {
    case Expression::Id::BlockId: {
      auto* block = curr->cast<Block>();
      addUniqueSymbol(SeparatorReason::makeBlockStart(block));
      for (auto& child : block->list) {
        Super::walk(child);
      }
      addUniqueSymbol(SeparatorReason::makeEnd());
      break;
    }
    case Expression::Id::IfId: {
      auto* iff = curr->cast<If>();
      addUniqueSymbol(SeparatorReason::makeIfStart(iff));
      Super::walk(iff->ifTrue);
      if (iff->ifFalse) {
        addUniqueSymbol(SeparatorReason::makeElseStart());
        Super::walk(iff->ifFalse);
      }
      addUniqueSymbol(SeparatorReason::makeEnd());
      break;
    }
    case Expression::Id::TryId: {
      auto* tryy = curr->cast<Try>();
      addUniqueSymbol(SeparatorReason::makeTryBodyStart());
      Super::walk(tryy->body);
      addUniqueSymbol(SeparatorReason::makeEnd());
      for (auto& child : tryy->catchBodies) {
        addUniqueSymbol(SeparatorReason::makeTryCatchStart());
        Super::walk(child);
        addUniqueSymbol(SeparatorReason::makeEnd());
      }
      break;
    }
    case Expression::Id::LoopId: {
      auto* loop = curr->cast<Loop>();
      addUniqueSymbol(SeparatorReason::makeLoopStart(loop));
      Super::walk(loop->body);
      addUniqueSymbol(SeparatorReason::makeEnd());
      break;
    }
    default: {
      assert(Properties::isControlFlowStructure(curr));
      WASM_UNREACHABLE("unexpected expression");
    }
  }
}